

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cc
# Opt level: O2

Range * re2c::Range::sub(Range *r1,Range *r2)

{
  uint uVar1;
  uint uVar2;
  Range *pRVar3;
  Range *pRVar4;
  uint u;
  Range **tail;
  Range *head;
  Range *local_20;
  
  local_20 = (Range *)0x0;
  pRVar4 = (Range *)&local_20;
LAB_0014d7ae:
  do {
    if (r1 == (Range *)0x0) {
      return local_20;
    }
    if (r2 == (Range *)0x0) {
      uVar2 = r1->ub;
LAB_0014d7d5:
      pRVar3 = ran(r1->lb,uVar2);
      pRVar4->nx = pRVar3;
    }
    else {
      u = r2->lb;
      uVar2 = r1->ub;
      if (uVar2 <= u) goto LAB_0014d7d5;
      uVar2 = r1->lb;
      if (r2->ub <= uVar2) {
        r2 = r2->nx;
        goto LAB_0014d7ae;
      }
      pRVar3 = pRVar4;
      if (u <= uVar2) goto LAB_0014d7fa;
      while( true ) {
        pRVar4 = ran(uVar2,u);
        pRVar3->nx = pRVar4;
LAB_0014d7fa:
        pRVar3 = pRVar4;
        if (r2 == (Range *)0x0) break;
        uVar2 = r2->ub;
        uVar1 = r1->ub;
        if (uVar1 <= uVar2) break;
        r2 = r2->nx;
        if ((r2 == (Range *)0x0) || (u = r2->lb, uVar1 <= r2->lb)) {
          u = uVar1;
        }
      }
    }
    r1 = r1->nx;
    pRVar4 = pRVar3;
  } while( true );
}

Assistant:

Range * Range::sub (const Range * r1, const Range * r2)
{
	Range * head = NULL;
	Range ** ptail = &head;
	while (r1)
	{
		if (!r2 || r2->lb >= r1->ub)
		{
			append (ptail, r1->lb, r1->ub);
			r1 = r1->nx;
		}
		else if (r2->ub <= r1->lb)
		{
			r2 = r2->nx;
		}
		else
		{
			if (r1->lb < r2->lb)
			{
				append (ptail, r1->lb, r2->lb);
			}
			while (r2 && r2->ub < r1->ub)
			{
				const uint32_t lb = r2->ub;
				r2 = r2->nx;
				const uint32_t ub = r2 && r2->lb < r1->ub
					? r2->lb
					: r1->ub;
				append (ptail, lb, ub);
			}
			r1 = r1->nx;
		}
	}
	return head;
}